

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.h
# Opt level: O0

size_type __thiscall bitmap::Bitmap::Deserialize(Bitmap *this,istream *in)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  char *in_RSI;
  long in_RDI;
  uint64_t i;
  size_t in_size;
  undefined8 local_40;
  undefined8 local_30;
  undefined8 local_20;
  undefined8 local_18;
  
  std::istream::read(in_RSI,in_RDI + 0x10);
  local_18 = 8;
  if ((*(ulong *)(in_RDI + 0x10) & 0x3f) == 0) {
    local_30 = *(ulong *)(in_RDI + 0x10) >> 6;
  }
  else {
    local_30 = (*(ulong *)(in_RDI + 0x10) >> 6) + 1;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_30;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pvVar3 = operator_new__(uVar2);
  *(void **)(in_RDI + 8) = pvVar3;
  local_20 = 0;
  while( true ) {
    if ((*(ulong *)(in_RDI + 0x10) & 0x3f) == 0) {
      local_40 = *(ulong *)(in_RDI + 0x10) >> 6;
    }
    else {
      local_40 = (*(ulong *)(in_RDI + 0x10) >> 6) + 1;
    }
    if (local_40 <= local_20) break;
    std::istream::read(in_RSI,*(long *)(in_RDI + 8) + local_20 * 8);
    local_18 = local_18 + 8;
    local_20 = local_20 + 1;
  }
  return local_18;
}

Assistant:

Bitmap::size_type Bitmap::Deserialize(std::istream& in) {
  size_t in_size = 0;

  in.read(reinterpret_cast<char *>(&size_), sizeof(uint64_t));
  in_size += sizeof(uint64_t);

  data_ = new uint64_t[BITS2BLOCKS(size_)];
  for (uint64_t i = 0; i < BITS2BLOCKS(size_); i++) {
    in.read(reinterpret_cast<char *>(&data_[i]), sizeof(uint64_t));
    in_size += sizeof(uint64_t);
  }

  return in_size;
}